

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lexer.cpp
# Opt level: O2

void __thiscall Lexer::match(Lexer *this,char *x)

{
  ostream *poVar1;
  lexer_exception *this_00;
  string local_1c0;
  stringstream buffer;
  ostream local_190 [376];
  
  if (this->current_ == *x) {
    buffer = (stringstream)0x1;
    consume(this,(bool *)&buffer);
    return;
  }
  std::__cxx11::stringstream::stringstream((stringstream *)&buffer);
  poVar1 = std::operator<<(local_190,anon_var_dwarf_3aa98);
  poVar1 = std::operator<<(poVar1,this->current_);
  poVar1 = std::operator<<(poVar1,anon_var_dwarf_3aab1);
  poVar1 = std::operator<<(poVar1,*x);
  std::operator<<(poVar1,anon_var_dwarf_3aa98 + 0x10);
  this_00 = (lexer_exception *)__cxa_allocate_exception(0x38);
  std::__cxx11::stringbuf::str();
  lexer_exception::lexer_exception(this_00,&this->position_,&local_1c0);
  __cxa_throw(this_00,&lexer_exception::typeinfo,lexer_exception::~lexer_exception);
}

Assistant:

void Lexer::match(const char &x) {
    if (current_ == x) {
        consume();
    } else {
        std::stringstream buffer;
        buffer << "错误的字符 '" << current_ << "', 期望得到 '" << x << "'";
        throw lexer_exception(position_, buffer.str());
    }
}